

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  
  pFVar1 = this->right_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (((this->left_->fadexpr_).left_)->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).right_;
  pdVar7 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar7 = (pFVar4->dx_).ptr_to_data + i;
  }
  pdVar6 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar6 = (pFVar2->dx_).ptr_to_data + i;
  }
  pdVar5 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar5 = (pFVar1->dx_).ptr_to_data + i;
  }
  return (*pdVar6 - *pdVar7 * (pFVar3->fadexpr_).left_.constant_) + *pdVar5;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}